

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O2

bool helics::fileops::callIfMember
               (value *element,string *key,
               function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
               *call)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  Time __args_1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  
  toml::basic_value<toml::type_config>::basic_value(&uval);
  v = toml::find_or<toml::type_config,std::__cxx11::string>
                (element,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key,
                 &uval);
  toml::basic_value<toml::type_config>::basic_value(&val,v);
  if (val.type_ != empty) {
    __args_1 = loadTomlTime(&val,sec);
    CLI::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
    ::operator()(call,key,(TimeRepresentation<count_time<9,_long>_>)__args_1.internalTimeCode);
  }
  toml::basic_value<toml::type_config>::~basic_value(&val);
  toml::basic_value<toml::type_config>::~basic_value(&uval);
  return val.type_ != empty;
}

Assistant:

inline bool callIfMember(const toml::value& element,
                         const std::string& key,
                         const std::function<void(const std::string&, helics::Time)>& call)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        call(key, loadTomlTime(val));
        return true;
    }
    return false;
}